

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_Init(void *arkode_mem,int init_type)

{
  long lVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  ARKEwtFn p_Var5;
  int in_ESI;
  long *in_RDI;
  int reset_efun;
  int j;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  SUNNonlinearSolver in_stack_ffffffffffffffb8;
  N_Vector in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int iVar6;
  ARKodeMem in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  undefined4 uStack_1c;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      ((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (char *)in_stack_ffffffffffffffc0,(ARKodeMem *)in_stack_ffffffffffffffb8,
                       (ARKodeMRIStepMem *)0xeb65a8);
  if (local_4 == 0) {
    if (in_ESI == 1) {
      local_4 = 0;
    }
    else {
      if (in_ESI == 0) {
        in_stack_ffffffffffffffcc = (uint)(in_stack_ffffffffffffffd8->ritol == 0);
        if (*(int *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x54) != 0) {
          in_stack_ffffffffffffffcc = 0;
        }
        if (in_stack_ffffffffffffffcc != 0) {
          *(undefined4 *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x54) = 0;
          *(code **)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x58) = arkEwtSetSmallReal;
          *(ulong *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x60) =
               CONCAT44(uStack_1c,in_stack_ffffffffffffffe0);
        }
        if (*(int *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x1a8) == 0) {
          arkProcessError((ARKodeMem)CONCAT44(uStack_1c,in_stack_ffffffffffffffe0),-0x16,
                          "ARKode::MRIStep","mriStep_Init",
                          "Adaptive outer time stepping is not currently supported");
          return -0x16;
        }
        iVar2 = mriStep_SetCoupling(in_stack_ffffffffffffffd8);
        if (iVar2 != 0) {
          arkProcessError((ARKodeMem)CONCAT44(uStack_1c,in_stack_ffffffffffffffe0),-0x16,
                          "ARKode::MRIStep","mriStep_Init","Could not create coupling table");
          return -0x16;
        }
        iVar2 = mriStep_CheckCoupling((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        if (iVar2 != 0) {
          arkProcessError((ARKodeMem)CONCAT44(uStack_1c,in_stack_ffffffffffffffe0),-0x16,
                          "ARKode::MRIStep","mriStep_Init","Error in coupling table");
          return -0x16;
        }
        *(undefined4 *)&in_stack_ffffffffffffffd8->VRabstol =
             *(undefined4 *)(*(long *)&in_stack_ffffffffffffffd8->atolmin0 + 4);
        *(undefined4 *)&in_stack_ffffffffffffffd8->SRabstol =
             *(undefined4 *)(*(long *)&in_stack_ffffffffffffffd8->atolmin0 + 8);
        *(undefined4 *)((long)&in_stack_ffffffffffffffd8->SRabstol + 4) =
             *(undefined4 *)(*(long *)&in_stack_ffffffffffffffd8->atolmin0 + 0xc);
        lVar1._0_4_ = in_stack_ffffffffffffffd8->Ratolmin0;
        lVar1._4_4_ = in_stack_ffffffffffffffd8->user_efun;
        if (lVar1 != 0) {
          free(*(void **)&in_stack_ffffffffffffffd8->Ratolmin0);
          in_stack_ffffffffffffffd8->Ratolmin0 = 0;
          in_stack_ffffffffffffffd8->user_efun = 0;
          *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220) =
               *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220) -
               (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol;
        }
        pvVar4 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->VRabstol,4);
        *(void **)&in_stack_ffffffffffffffd8->Ratolmin0 = pvVar4;
        *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220) =
             (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol +
             *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220);
        iVar2 = mriStepCoupling_GetStageMap
                          (*(MRIStepCoupling *)&in_stack_ffffffffffffffd8->atolmin0,
                           *(int **)&in_stack_ffffffffffffffd8->Ratolmin0,
                           (int *)((long)&in_stack_ffffffffffffffd8->VRabstol + 4));
        if (iVar2 != 0) {
          arkProcessError((ARKodeMem)CONCAT44(uStack_1c,in_stack_ffffffffffffffe0),-0x16,
                          "ARKode::MRIStep","mriStep_Init","Error in coupling table");
          return -0x16;
        }
        if (in_stack_ffffffffffffffd8->efun != (ARKEwtFn)0x0) {
          free(in_stack_ffffffffffffffd8->efun);
          in_stack_ffffffffffffffd8->efun = (ARKEwtFn)0x0;
          *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220) =
               *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220) -
               (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol;
        }
        p_Var5 = (ARKEwtFn)calloc((long)*(int *)&in_stack_ffffffffffffffd8->VRabstol,4);
        in_stack_ffffffffffffffd8->efun = p_Var5;
        *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220) =
             (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol +
             *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220);
        for (iVar6 = 0; iVar6 < *(int *)&in_stack_ffffffffffffffd8->VRabstol; iVar6 = iVar6 + 1) {
          iVar3 = mriStepCoupling_GetStageType
                            (*(MRIStepCoupling *)&in_stack_ffffffffffffffd8->atolmin0,iVar6);
          *(int *)(in_stack_ffffffffffffffd8->efun + (long)iVar6 * 4) = iVar3;
        }
        if (in_stack_ffffffffffffffd8->e_data != (void *)0x0) {
          free(in_stack_ffffffffffffffd8->e_data);
          in_stack_ffffffffffffffd8->e_data = (void *)0x0;
          *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218) =
               *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218) -
               (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol;
        }
        pvVar4 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->VRabstol,8);
        in_stack_ffffffffffffffd8->e_data = pvVar4;
        *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218) =
             (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol +
             *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218);
        if (*(long *)&in_stack_ffffffffffffffd8->user_rfun != 0) {
          free(*(void **)&in_stack_ffffffffffffffd8->user_rfun);
          *(undefined8 *)&in_stack_ffffffffffffffd8->user_rfun = 0;
          *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218) =
               *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218) -
               (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol;
        }
        pvVar4 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->VRabstol,8);
        *(void **)&in_stack_ffffffffffffffd8->user_rfun = pvVar4;
        *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218) =
             (long)*(int *)&in_stack_ffffffffffffffd8->VRabstol +
             *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218);
        if (in_stack_ffffffffffffffd8->itol != 0) {
          in_stack_ffffffffffffffb8 =
               (SUNNonlinearSolver)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220);
          iVar3 = arkAllocVecArray(in_stack_ffffffffffffffe0,(N_Vector)in_stack_ffffffffffffffd8,
                                   (N_Vector **)CONCAT44(iVar2,iVar6),in_stack_ffffffffffffffcc,
                                   (long *)in_stack_ffffffffffffffc0,
                                   (sunindextype)((ulong)in_stack_ffffffffffffffb8 >> 0x20),in_RDI);
          if (iVar3 == 0) {
            return -0x14;
          }
        }
        if (in_stack_ffffffffffffffd8->ritol != 0) {
          in_stack_ffffffffffffffb8 =
               (SUNNonlinearSolver)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220);
          iVar6 = arkAllocVecArray(in_stack_ffffffffffffffe0,(N_Vector)in_stack_ffffffffffffffd8,
                                   (N_Vector **)CONCAT44(iVar2,iVar6),in_stack_ffffffffffffffcc,
                                   (long *)in_stack_ffffffffffffffc0,
                                   (sunindextype)((ulong)in_stack_ffffffffffffffb8 >> 0x20),in_RDI);
          if (iVar6 == 0) {
            return -0x14;
          }
        }
        if (in_stack_ffffffffffffffd8->ritol == 0) {
          if ((in_stack_ffffffffffffffd8->step_attachmasssol != (ARKTimestepAttachMasssolFn)0x0) &&
             (*(int *)&in_stack_ffffffffffffffd8->step_disablelsetup != 0)) {
            SUNNonlinSolFree(in_stack_ffffffffffffffb8);
            in_stack_ffffffffffffffd8->step_attachmasssol = (ARKTimestepAttachMasssolFn)0x0;
            *(undefined4 *)&in_stack_ffffffffffffffd8->step_disablelsetup = 0;
          }
          iVar6 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
          in_stack_ffffffffffffffd8->tempv2 = (N_Vector)0x0;
          in_stack_ffffffffffffffd8->tempv3 = (N_Vector)0x0;
          in_stack_ffffffffffffffd8->tempv4 = (N_Vector)0x0;
          in_stack_ffffffffffffffd8->constraints = (N_Vector)0x0;
          in_stack_ffffffffffffffd8->interp = (ARKInterp)0x0;
        }
        else {
          iVar6 = arkAllocVec((ARKodeMem)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc0,(N_Vector *)in_stack_ffffffffffffffb8);
          if (iVar6 == 0) {
            return -0x14;
          }
          iVar6 = arkAllocVec((ARKodeMem)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc0,(N_Vector *)in_stack_ffffffffffffffb8);
          if (iVar6 == 0) {
            return -0x14;
          }
          iVar3 = arkAllocVec((ARKodeMem)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc0,(N_Vector *)in_stack_ffffffffffffffb8);
          iVar6 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
          if (iVar3 == 0) {
            return -0x14;
          }
        }
        *(int *)&in_stack_ffffffffffffffd8->eta =
             *(int *)&in_stack_ffffffffffffffd8->VRabstol * 2 + 2;
        if (in_stack_ffffffffffffffd8->tcur == 0.0) {
          pvVar4 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->eta,8);
          in_stack_ffffffffffffffd8->tcur = (realtype)pvVar4;
          if (in_stack_ffffffffffffffd8->tcur == 0.0) {
            return -0x14;
          }
          *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218) =
               (long)*(int *)&in_stack_ffffffffffffffd8->eta +
               *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x218);
        }
        if (in_stack_ffffffffffffffd8->tretlast == 0.0) {
          pvVar4 = calloc((long)*(int *)&in_stack_ffffffffffffffd8->eta,8);
          in_stack_ffffffffffffffd8->tretlast = (realtype)pvVar4;
          if (in_stack_ffffffffffffffd8->tretlast == 0.0) {
            return -0x14;
          }
          *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220) =
               (long)*(int *)&in_stack_ffffffffffffffd8->eta +
               *(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x220);
        }
        iVar2 = mriStepInnerStepper_AllocVecs
                          ((MRIStepInnerStepper)in_stack_ffffffffffffffd8,iVar2,
                           (N_Vector)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        if (iVar2 != 0) {
          arkProcessError((ARKodeMem)CONCAT44(uStack_1c,in_stack_ffffffffffffffe0),-0x16,
                          "ARKode::MRIStep","mriStep_Init","Error allocating inner stepper memory");
          return -0x14;
        }
        if ((*(long *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x148) != 0) &&
           (iVar2 = arkInterpSetDegree((void *)CONCAT44(in_stack_ffffffffffffffcc,
                                                        in_stack_ffffffffffffffc8),
                                       (ARKInterp)in_stack_ffffffffffffffc0,iVar6), iVar2 != 0)) {
          arkProcessError((ARKodeMem)CONCAT44(uStack_1c,in_stack_ffffffffffffffe0),-0x16,
                          "ARKode::MRIStep","mriStep_Init",
                          "Unable to update interpolation polynomial degree");
          return -0x16;
        }
      }
      if ((in_stack_ffffffffffffffd8->tempv2 == (N_Vector)0x0) ||
         (iVar2 = (*(code *)in_stack_ffffffffffffffd8->tempv2)
                            (CONCAT44(uStack_1c,in_stack_ffffffffffffffe0)), iVar2 == 0)) {
        if ((in_stack_ffffffffffffffd8->step_attachmasssol == (ARKTimestepAttachMasssolFn)0x0) ||
           (iVar2 = mriStep_NlsInit((ARKodeMem)
                                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
           iVar2 == 0)) {
          *(undefined4 *)(CONCAT44(uStack_1c,in_stack_ffffffffffffffe0) + 0x264) = 1;
          local_4 = 0;
        }
        else {
          arkProcessError((ARKodeMem)CONCAT44(uStack_1c,in_stack_ffffffffffffffe0),-0x1d,
                          "ARKode::MRIStep","mriStep_Init",
                          "Unable to initialize SUNNonlinearSolver object");
          local_4 = -0x1d;
        }
      }
      else {
        arkProcessError((ARKodeMem)CONCAT44(uStack_1c,in_stack_ffffffffffffffe0),-5,
                        "ARKode::MRIStep","mriStep_Init","The linear solver\'s init routine failed."
                       );
        local_4 = -5;
      }
    }
  }
  return local_4;
}

Assistant:

int mriStep_Init(void* arkode_mem, int init_type)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval, j;
  booleantype reset_efun;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_Init",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* immediately return if reset */
  if (init_type == RESET_INIT) return(ARK_SUCCESS);

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT) {

    /* enforce use of arkEwtSmallReal if using a fixed step size for
       an explicit method and an internal error weight function */
    reset_efun = SUNTRUE;
    if ( step_mem->implicit_rhs )  reset_efun = SUNFALSE;
    if ( ark_mem->user_efun )  reset_efun = SUNFALSE;
    if (reset_efun) {
      ark_mem->user_efun = SUNFALSE;
      ark_mem->efun      = arkEwtSetSmallReal;
      ark_mem->e_data    = ark_mem;
    }

    /* assume fixed outer step size */
    if (!ark_mem->fixedstep) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Adaptive outer time stepping is not currently supported");
      return(ARK_ILL_INPUT);
    }

    /* Create coupling structure (if not already set) */
    retval = mriStep_SetCoupling(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Could not create coupling table");
      return(ARK_ILL_INPUT);
    }

    /* Check that coupling structure is OK */
    retval = mriStep_CheckCoupling(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_Init", "Error in coupling table");
      return(ARK_ILL_INPUT);
    }

    /* Retrieve/store method and embedding orders now that tables are finalized */
    step_mem->stages = step_mem->MRIC->stages;
    step_mem->q = step_mem->MRIC->q;
    step_mem->p = step_mem->MRIC->p;

    /* allocate/fill derived quantities from MRIC structure */

    /* stage map */
    if (step_mem->stage_map) {
      free(step_mem->stage_map);
      step_mem->stage_map = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    step_mem->stage_map = (int *) calloc(step_mem->stages, sizeof(int));
    ark_mem->liw += step_mem->stages;

    retval = mriStepCoupling_GetStageMap(step_mem->MRIC,
                                         step_mem->stage_map,
                                         &(step_mem->nstages_stored));
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_Init", "Error in coupling table");
      return(ARK_ILL_INPUT);
    }

    /* stage types */
    if (step_mem->stagetypes) {
      free(step_mem->stagetypes);
      step_mem->stagetypes = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    step_mem->stagetypes = (int *) calloc(step_mem->stages, sizeof(int));
    ark_mem->liw += step_mem->stages;
    for (j=0; j<step_mem->stages; j++)
      step_mem->stagetypes[j] = mriStepCoupling_GetStageType(step_mem->MRIC, j);

    /* explicit RK coefficient row */
    if (step_mem->Ae_row) {
      free(step_mem->Ae_row);
      step_mem->Ae_row = NULL;
      ark_mem->lrw -= step_mem->stages;
    }
    step_mem->Ae_row = (realtype *) calloc(step_mem->stages,
                                           sizeof(realtype));
    ark_mem->lrw += step_mem->stages;

    /* implicit RK coefficient row */
    if (step_mem->Ai_row) {
      free(step_mem->Ai_row);
      step_mem->Ai_row = NULL;
      ark_mem->lrw -= step_mem->stages;
    }
    step_mem->Ai_row = (realtype *) calloc(step_mem->stages,
                                           sizeof(realtype));
    ark_mem->lrw += step_mem->stages;

    /* Allocate MRI RHS vector memory, update storage requirements */
    /*   Allocate Fse[0] ... Fse[nstages_stored - 1] if needed */
    if (step_mem->explicit_rhs) {
      if (!arkAllocVecArray(step_mem->nstages_stored,
                            ark_mem->ewt, &(step_mem->Fse),
                            ark_mem->lrw1, &(ark_mem->lrw),
                            ark_mem->liw1, &(ark_mem->liw)))
        return(ARK_MEM_FAIL);
    }

    /*   Allocate Fsi[0] ... Fsi[nstages_stored - 1] if needed */
    if (step_mem->implicit_rhs) {
      if (!arkAllocVecArray(step_mem->nstages_stored,
                            ark_mem->ewt, &(step_mem->Fsi),
                            ark_mem->lrw1, &(ark_mem->lrw),
                            ark_mem->liw1, &(ark_mem->liw)))
        return(ARK_MEM_FAIL);
    }

    /* if any slow stage is implicit, allocate sdata, zpred, zcor vectors;
       if all stages explicit, free default NLS object, and detach all
       linear solver routines.  Note: step_mem->implicit_rhs will only equal
       SUNTRUE if an implicit table has been user-provided. */
    if (step_mem->implicit_rhs) {
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->sdata)))
        return(ARK_MEM_FAIL);
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->zpred)))
        return(ARK_MEM_FAIL);
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->zcor)))
        return(ARK_MEM_FAIL);
    } else {
      if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {
        SUNNonlinSolFree(step_mem->NLS);
        step_mem->NLS = NULL;
        step_mem->ownNLS = SUNFALSE;
      }
      step_mem->linit  = NULL;
      step_mem->lsetup = NULL;
      step_mem->lsolve = NULL;
      step_mem->lfree  = NULL;
      step_mem->lmem   = NULL;
    }

    /* Allocate reusable arrays for fused vector interface */
    step_mem->nfusedopvecs = 2*step_mem->stages + 2;
    if (step_mem->cvals == NULL) {
      step_mem->cvals = (realtype *) calloc(step_mem->nfusedopvecs, sizeof(realtype));
      if (step_mem->cvals == NULL)  return(ARK_MEM_FAIL);
      ark_mem->lrw += (step_mem->nfusedopvecs);
    }
    if (step_mem->Xvecs == NULL) {
      step_mem->Xvecs = (N_Vector *) calloc(step_mem->nfusedopvecs, sizeof(N_Vector));
      if (step_mem->Xvecs == NULL)  return(ARK_MEM_FAIL);
      ark_mem->liw += (step_mem->nfusedopvecs);   /* pointers */
    }

    /* Allocate inner stepper data */
    retval = mriStepInnerStepper_AllocVecs(step_mem->stepper,
                                           step_mem->MRIC->nmat, ark_mem->ewt);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Error allocating inner stepper memory");
      return(ARK_MEM_FAIL);
    }

    /* Limit interpolant degree based on method order (use negative
       argument to specify update instead of overwrite) */
    if (ark_mem->interp != NULL) {
      retval = arkInterpSetDegree(ark_mem, ark_mem->interp, -(step_mem->q-1));
      if (retval != ARK_SUCCESS) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                        "Unable to update interpolation polynomial degree");
        return(ARK_ILL_INPUT);
      }
    }

  }

  /* Call linit (if it exists) */
  if (step_mem->linit) {
    retval = step_mem->linit(ark_mem);
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_LINIT_FAIL, "ARKode::MRIStep", "mriStep_Init",
                      MSG_ARK_LINIT_FAIL);
      return(ARK_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver object (if it exists) */
  if (step_mem->NLS) {
    retval = mriStep_NlsInit(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_NLS_INIT_FAIL, "ARKode::MRIStep", "mriStep_Init",
                      "Unable to initialize SUNNonlinearSolver object");
      return(ARK_NLS_INIT_FAIL);
    }
  }

  /* Signal to shared arkode module that fullrhs is required after each step */
  ark_mem->call_fullrhs = SUNTRUE;

  return(ARK_SUCCESS);
}